

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O1

Bdc_Man_t * Bdc_ManAlloc(Bdc_Par_t *pPars)

{
  uint uVar1;
  undefined4 uVar2;
  void *pvVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  Bdc_Man_t *__s;
  Bdc_Fun_t *pBVar7;
  Vec_Int_t *pVVar8;
  int *__s_00;
  Bdc_Fun_t **__s_01;
  Vec_Int_t *pVVar9;
  int *piVar10;
  void **ppvVar11;
  long lVar12;
  Vec_Ptr_t *pVVar13;
  uint *puVar14;
  long lVar15;
  uint *puVar16;
  int nWords;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  size_t __size;
  ulong uVar20;
  
  __s = (Bdc_Man_t *)malloc(0x148);
  uVar20 = 0;
  memset(__s,0,0x148);
  uVar1 = pPars->nVarsMax;
  uVar18 = (ulong)uVar1;
  if (0xd < uVar1 - 2) {
    __assert_fail("pPars->nVarsMax > 1 && pPars->nVarsMax < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                  ,0x49,"Bdc_Man_t *Bdc_ManAlloc(Bdc_Par_t *)");
  }
  bVar5 = (byte)uVar1;
  uVar4 = 1 << (bVar5 - 5 & 0x1f);
  if ((int)uVar1 < 6) {
    uVar4 = 1;
  }
  __s->pPars = pPars;
  __s->nWords = uVar4;
  __s->nDivsLimit = 200;
  __s->nNodesAlloc = 0x200;
  pBVar7 = (Bdc_Fun_t *)malloc(0x7000);
  __s->pNodes = pBVar7;
  iVar19 = uVar4 << 0xc;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar19;
  __s_00 = (int *)malloc((long)iVar19 * 4);
  pVVar8->pArray = __s_00;
  pVVar8->nSize = iVar19;
  memset(__s_00,0,(long)iVar19 * 4);
  __s->vMemory = pVVar8;
  pVVar8->nSize = 0;
  __s->nTableSize = 1 << (bVar5 & 0x1f);
  __size = 8L << (bVar5 & 0x3f);
  __s_01 = (Bdc_Fun_t **)malloc(__size);
  __s->pTable = __s_01;
  memset(__s_01,0,__size);
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x400);
  pVVar9->pArray = piVar10;
  __s->vSpots = pVVar9;
  ppvVar11 = (void **)malloc(((long)(int)uVar4 * 4 + 8) * uVar18);
  lVar12 = uVar18 * 8;
  do {
    ppvVar11[uVar20] = (void *)(lVar12 + (long)ppvVar11);
    uVar20 = uVar20 + 1;
    lVar12 = lVar12 + (long)(int)uVar4 * 4;
  } while (uVar18 != uVar20);
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  pVVar13->nSize = uVar1;
  pVVar13->nCap = uVar1;
  pVVar13->pArray = ppvVar11;
  if (0 < (int)uVar1) {
    uVar20 = 0;
    do {
      pvVar3 = ppvVar11[uVar20];
      if (uVar20 < 5) {
        if (0 < (int)uVar4) {
          uVar2 = (&DAT_009442b0)[uVar20];
          uVar17 = 0;
          do {
            *(undefined4 *)((long)pvVar3 + uVar17 * 4) = uVar2;
            uVar17 = uVar17 + 1;
          } while (uVar4 != uVar17);
        }
      }
      else if (0 < (int)uVar4) {
        uVar17 = 0;
        do {
          *(uint *)((long)pvVar3 + uVar17 * 4) =
               -(uint)((1 << ((char)uVar20 - 5U & 0x1f) & (uint)uVar17) != 0);
          uVar17 = uVar17 + 1;
        } while (uVar4 != uVar17);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar18);
  }
  __s->vTruths = pVVar13;
  iVar19 = __s->nWords;
  lVar12 = (long)iVar19;
  puVar14 = (uint *)malloc(lVar12 << 4);
  __s->puTemp1 = puVar14;
  puVar14 = puVar14 + lVar12;
  __s->puTemp2 = puVar14;
  __s->puTemp3 = puVar14 + lVar12;
  __s->puTemp4 = puVar14 + lVar12 + lVar12;
  __s->pIsfOL = &__s->IsfOL;
  (__s->IsfOL).uSupp = 0;
  (__s->IsfOL).uUniq = 0;
  if (lVar12 == 0) {
    puVar14 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) {
      puVar14 = (uint *)0x0;
    }
    else {
      puVar14 = (uint *)(__s_00 + (lVar15 - lVar12));
    }
  }
  (__s->IsfOL).puOn = puVar14;
  if (iVar19 == 0) {
LAB_00545866:
    puVar16 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) goto LAB_00545866;
    puVar16 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfOL).puOff = puVar16;
  if ((puVar16 == (uint *)0x0) || (puVar14 == (uint *)0x0)) goto LAB_00545a76;
  __s->pIsfOR = &__s->IsfOR;
  (__s->IsfOR).uSupp = 0;
  (__s->IsfOR).uUniq = 0;
  if (iVar19 == 0) {
LAB_005458c7:
    puVar14 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) goto LAB_005458c7;
    puVar14 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfOR).puOn = puVar14;
  if (iVar19 == 0) {
LAB_005458fd:
    puVar16 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) goto LAB_005458fd;
    puVar16 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfOR).puOff = puVar16;
  if ((puVar16 == (uint *)0x0) || (puVar14 == (uint *)0x0)) goto LAB_00545a76;
  __s->pIsfAL = &__s->IsfAL;
  (__s->IsfAL).uSupp = 0;
  (__s->IsfAL).uUniq = 0;
  if (iVar19 == 0) {
LAB_0054595e:
    puVar14 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) goto LAB_0054595e;
    puVar14 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfAL).puOn = puVar14;
  if (iVar19 == 0) {
LAB_00545994:
    puVar16 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) goto LAB_00545994;
    puVar16 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfAL).puOff = puVar16;
  if ((puVar16 == (uint *)0x0) || (puVar14 == (uint *)0x0)) goto LAB_00545a76;
  __s->pIsfAR = &__s->IsfAR;
  (__s->IsfAR).uSupp = 0;
  (__s->IsfAR).uUniq = 0;
  if (iVar19 == 0) {
LAB_005459f3:
    puVar14 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) goto LAB_00545a57;
    lVar15 = pVVar8->nSize + lVar12;
    iVar6 = (int)lVar15;
    pVVar8->nSize = iVar6;
    if (pVVar8->nCap < iVar6) goto LAB_005459f3;
    puVar14 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfAR).puOn = puVar14;
  if (iVar19 == 0) {
LAB_00545a25:
    puVar16 = (uint *)0x0;
  }
  else {
    if (iVar19 < 1) {
LAB_00545a57:
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar15 = pVVar8->nSize + lVar12;
    iVar19 = (int)lVar15;
    pVVar8->nSize = iVar19;
    if (pVVar8->nCap < iVar19) goto LAB_00545a25;
    puVar16 = (uint *)(__s_00 + (lVar15 - lVar12));
  }
  (__s->IsfAR).puOff = puVar16;
  if ((puVar16 != (uint *)0x0) && (puVar14 != (uint *)0x0)) {
    return __s;
  }
LAB_00545a76:
  __assert_fail("pF->puOff && pF->puOn",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcInt.h"
                ,0x83,"void Bdc_IsfStart(Bdc_Man_t *, Bdc_Isf_t *)");
}

Assistant:

Bdc_Man_t * Bdc_ManAlloc( Bdc_Par_t * pPars )
{
    Bdc_Man_t * p;
    p = ABC_ALLOC( Bdc_Man_t, 1 );
    memset( p, 0, sizeof(Bdc_Man_t) );
    assert( pPars->nVarsMax > 1 && pPars->nVarsMax < 16 );
    p->pPars = pPars;
    p->nWords = Kit_TruthWordNum( pPars->nVarsMax );
    p->nDivsLimit = 200;
    // internal nodes
    p->nNodesAlloc = 512;
    p->pNodes = ABC_ALLOC( Bdc_Fun_t, p->nNodesAlloc );
    // memory
    p->vMemory = Vec_IntStart( 8 * p->nWords * p->nNodesAlloc );
    Vec_IntClear(p->vMemory);
    // set up hash table
    p->nTableSize = (1 << p->pPars->nVarsMax);
    p->pTable = ABC_ALLOC( Bdc_Fun_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Bdc_Fun_t *) * p->nTableSize );
    p->vSpots = Vec_IntAlloc( 256 );
    // truth tables
    p->vTruths = Vec_PtrAllocTruthTables( p->pPars->nVarsMax );
    p->puTemp1 = ABC_ALLOC( unsigned, 4 * p->nWords );
    p->puTemp2 = p->puTemp1 + p->nWords;
    p->puTemp3 = p->puTemp2 + p->nWords;
    p->puTemp4 = p->puTemp3 + p->nWords;
    // start the internal ISFs
    p->pIsfOL = &p->IsfOL;  Bdc_IsfStart( p, p->pIsfOL );
    p->pIsfOR = &p->IsfOR;  Bdc_IsfStart( p, p->pIsfOR );
    p->pIsfAL = &p->IsfAL;  Bdc_IsfStart( p, p->pIsfAL );
    p->pIsfAR = &p->IsfAR;  Bdc_IsfStart( p, p->pIsfAR );   
    return p; 
}